

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCodes.h
# Opt level: O0

void jbcoin::RPC::inject_error<Json::Value>(error_code_i code,string *message,Value *json)

{
  Value *pVVar1;
  Value local_68;
  Value local_58 [2];
  Value local_38;
  ErrorInfo *local_28;
  ErrorInfo *info;
  Value *json_local;
  string *message_local;
  error_code_i code_local;
  
  info = (ErrorInfo *)json;
  json_local = (Value *)message;
  message_local._4_4_ = code;
  local_28 = get_error_info(code);
  Json::Value::Value(&local_38,&local_28->token);
  pVVar1 = Json::Value::operator[]((Value *)info,(StaticString *)&jss::error);
  Json::Value::operator=(pVVar1,&local_38);
  Json::Value::~Value(&local_38);
  Json::Value::Value(local_58,local_28->code);
  pVVar1 = Json::Value::operator[]((Value *)info,(StaticString *)&jss::error_code);
  Json::Value::operator=(pVVar1,local_58);
  Json::Value::~Value(local_58);
  Json::Value::Value(&local_68,(string *)json_local);
  pVVar1 = Json::Value::operator[]((Value *)info,(StaticString *)&jss::error_message);
  Json::Value::operator=(pVVar1,&local_68);
  Json::Value::~Value(&local_68);
  return;
}

Assistant:

void inject_error (
    error_code_i code, std::string const& message, JsonValue& json)
{
    ErrorInfo const& info (get_error_info (code));
    json [jss::error] = info.token;
    json [jss::error_code] = info.code;
    json [jss::error_message] = message;
}